

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void outchar_html_stream(out_stream_info *stream,uint htmlchar)

{
  char c;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  char xlat_buf [50];
  char local_48;
  char local_47 [55];
  
  pcVar3 = &local_48;
  uVar1 = 0xffffffffffffffe8;
  do {
    if (*(uint *)((long)&amp_tbl[1].html_cval + uVar1) == htmlchar) {
      pcVar2 = *(char **)((long)&amp_tbl[1].expan + uVar1);
      if (pcVar2 != (char *)0x0) {
        c = *pcVar2;
        while (c != '\0') {
          pcVar2 = pcVar2 + 1;
          outchar_noxlat_stream(stream,c);
          c = *pcVar2;
        }
        return;
      }
      break;
    }
    uVar1 = uVar1 + 0x18;
  } while (uVar1 < 0x1c98);
  os_xlat_html4(htmlchar,&local_48,0x32);
  while (local_48 != '\0') {
    pcVar3 = pcVar3 + 1;
    outchar_noxlat_stream(stream,local_48);
    local_48 = *pcVar3;
  }
  return;
}

Assistant:

static void outchar_html_stream(out_stream_info *stream,
                                unsigned int htmlchar)
{
    struct amp_tbl_t *ampptr;

    /* 
     *   search for a mapping entry for this entity, in case it's defined
     *   in an external mapping file 
     */
    for (ampptr = amp_tbl ;
         ampptr < amp_tbl + sizeof(amp_tbl)/sizeof(amp_tbl[0]) ; ++ampptr)
    {
        /* if this is the one, stop looking */
        if (ampptr->html_cval == htmlchar)
            break;
    }

    /* 
     *   If we found a mapping table entry, and the entry has an expansion
     *   from the external character mapping table file, use the external
     *   expansion; otherwise, use the default expansion.  
     */
    if (ampptr >= amp_tbl + sizeof(amp_tbl)/sizeof(amp_tbl[0])
        || ampptr->expan == 0)
    {
        char xlat_buf[50];

        /* 
         *   there's no external mapping table file expansion -- use the
         *   default OS mapping routine 
         */
        os_xlat_html4(htmlchar, xlat_buf, sizeof(xlat_buf));
        outstring_noxlat_stream(stream, xlat_buf);
    }
    else
    {
        /* 
         *   use the explicit mapping from the mapping table file 
         */
        outstring_noxlat_stream(stream, ampptr->expan);
    }
}